

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzero.cpp
# Opt level: O0

Machine * unifyValue(Machine *__return_storage_ptr__,Machine *m,Register r)

{
  Addr a2;
  Addr a1;
  mapped_type *pmVar1;
  mapped_type *this;
  Addr local_128 [2];
  int local_110;
  Addr local_10c;
  Machine local_100;
  Machine local_90;
  Machine *local_20;
  Machine *m_local;
  Machine *pMStack_10;
  Register r_local;
  
  local_20 = m;
  m_local._4_4_ = r.r;
  pMStack_10 = __return_storage_ptr__;
  if (m->mode == Read) {
    Machine::Machine(&local_100,m);
    local_110 = m_local._4_4_;
    Addr::Addr(&local_10c,m_local._4_4_);
    Addr::Addr(local_128,(Hix)(m->s).hix);
    a1.hix_.hix = local_10c.hix_.hix;
    a1.tag_ = local_10c.tag_;
    a1.r_.r = local_10c.r_.r;
    a2.hix_.hix = local_128[0].hix_.hix;
    a2.tag_ = local_128[0].tag_;
    a2.r_.r = local_128[0].r_.r;
    unify(&local_90,&local_100,a1,a2);
    Machine::operator=(m,&local_90);
    Machine::~Machine(&local_90);
    Machine::~Machine(&local_100);
  }
  else if (m->mode == Write) {
    pmVar1 = std::
             map<Register,_Hcell,_std::less<Register>,_std::allocator<std::pair<const_Register,_Hcell>_>_>
             ::operator[](&m->regval,(key_type *)((long)&m_local + 4));
    this = std::map<Hix,_Hcell,_std::less<Hix>,_std::allocator<std::pair<const_Hix,_Hcell>_>_>::
           operator[](&m->heap,&m->h);
    Hcell::operator=(this,pmVar1);
    Hix::operator+=(&m->h,1);
  }
  Hix::operator+=(&m->s,1);
  Machine::Machine(__return_storage_ptr__,m);
  return __return_storage_ptr__;
}

Assistant:

Machine unifyValue(Machine m, Register r) {
    switch (m.mode) {
        case Mode::Read:
            m = unify(m, r, m.s);
            break;
        case Mode::Write:
            m.heap[m.h] = m.regval[r];
            m.h += 1;
            break;
    }
    m.s += 1;
    return m;
}